

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_Commands.cpp
# Opt level: O2

void __thiscall
BanSearchIRCCommand::trigger
          (BanSearchIRCCommand *this,IRC_Bot *source,string_view channel,string_view nick,
          string_view parameters)

{
  long lVar1;
  long lVar2;
  undefined4 uVar3;
  bool bVar4;
  uint uVar5;
  long *plVar6;
  tm *ptVar7;
  char *pcVar8;
  long lVar9;
  uint __args;
  size_t sVar10;
  basic_string_view<char,_std::char_traits<char>_> rhs;
  basic_string_view<char,_std::char_traits<char>_> __y;
  basic_string_view<char,_std::char_traits<char>_> rhs_00;
  basic_string_view<char,_std::char_traits<char>_> rhs_01;
  basic_string_view<char,_std::char_traits<char>_> rhs_02;
  basic_string_view<char,_std::char_traits<char>_> rhs_03;
  basic_string_view<char,_std::char_traits<char>_> rhs_04;
  basic_string_view<char,_std::char_traits<char>_> rhs_05;
  basic_string_view<char,_std::char_traits<char>_> rhs_06;
  Entry *entry;
  time_t expire_time;
  char *local_320;
  char *local_308;
  IRC_Bot *local_300;
  size_t local_2f8;
  string types;
  time_t added_time;
  function<bool_(unsigned_int)> isMatch;
  string out;
  string_view params;
  string ip_str;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  command_split;
  char dateStr [256];
  char expireStr [256];
  
  pcVar8 = nick._M_str;
  sVar10 = nick._M_len;
  plVar6 = (long *)RenX::BanDatabase::getEntries();
  if (parameters._M_len == 0) {
    string_printf_abi_cxx11_
              ((string *)dateStr,"There are a total of %u entries in the ban database.",
               plVar6[1] - *plVar6 >> 3);
    Jupiter::IRC::Client::sendNotice(source,sVar10,pcVar8,dateStr._8_8_,dateStr._0_8_);
    std::__cxx11::string::~string((string *)dateStr);
  }
  else {
    if (plVar6[1] == *plVar6) {
      Jupiter::IRC::Client::sendNotice(source,sVar10,pcVar8,0x1a,"The ban database is empty!");
      return;
    }
    dateStr[0] = (undefined1)parameters._M_len;
    dateStr[1] = parameters._M_len._1_1_;
    dateStr[2] = parameters._M_len._2_1_;
    dateStr[3] = parameters._M_len._3_1_;
    dateStr[4] = parameters._M_len._4_1_;
    dateStr[5] = parameters._M_len._5_1_;
    dateStr[6] = parameters._M_len._6_1_;
    dateStr[7] = parameters._M_len._7_1_;
    dateStr._8_8_ = parameters._M_str;
    expireStr[0] = '\x02';
    expireStr[1] = '\0';
    expireStr[2] = '\0';
    expireStr[3] = '\0';
    expireStr[4] = '\0';
    expireStr[5] = '\0';
    expireStr[6] = '\0';
    expireStr[7] = '\0';
    expireStr._8_8_ = anon_var_dwarf_ef54;
    local_300 = source;
    local_2f8 = sVar10;
    jessilib::
    word_split_once<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_nullptr>
              (&command_split,(basic_string_view<char,_std::char_traits<char>_> *)dateStr,
               (basic_string_view<char,_std::char_traits<char>_> *)expireStr);
    params._M_len = command_split.second._M_len;
    params._M_str = command_split.second._M_str;
    isMatch.super__Function_base._M_manager = (_Manager_type)0x0;
    isMatch._M_invoker = (_Invoker_type)0x0;
    isMatch.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
    isMatch.super__Function_base._M_functor._8_8_ = 0;
    isMatch.super__Function_base._M_functor._M_unused._M_object = operator_new(0x18);
    *(function<bool_(unsigned_int)> **)isMatch.super__Function_base._M_functor._M_unused._0_8_ =
         &isMatch;
    *(Entry ***)((long)isMatch.super__Function_base._M_functor._M_unused._0_8_ + 8) = &entry;
    *(string_view **)((long)isMatch.super__Function_base._M_functor._M_unused._0_8_ + 0x10) =
         &params;
    isMatch._M_invoker =
         std::
         _Function_handler<bool_(unsigned_int),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Plugins/RenX/RenX.Commands/RenX_Commands.cpp:1888:48)>
         ::_M_invoke;
    isMatch.super__Function_base._M_manager =
         std::
         _Function_handler<bool_(unsigned_int),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Plugins/RenX/RenX.Commands/RenX_Commands.cpp:1888:48)>
         ::_M_manager;
    rhs._M_str = "all";
    rhs._M_len = 3;
    bVar4 = jessilib::equalsi<char,char>(command_split.first,rhs);
    __args = 1;
    if ((!bVar4) &&
       (__y._M_str = "*", __y._M_len = 1, bVar4 = std::operator==(command_split.first,__y), !bVar4))
    {
      rhs_00._M_str = "ip";
      rhs_00._M_len = 2;
      bVar4 = jessilib::equalsi<char,char>(command_split.first,rhs_00);
      if (bVar4) {
        __args = 2;
      }
      else {
        rhs_01._M_str = "hwid";
        rhs_01._M_len = 4;
        bVar4 = jessilib::equalsi<char,char>(command_split.first,rhs_01);
        if (bVar4) {
          __args = 3;
        }
        else {
          rhs_02._M_str = "rdns";
          rhs_02._M_len = 4;
          bVar4 = jessilib::equalsi<char,char>(command_split.first,rhs_02);
          if (bVar4) {
            __args = 4;
          }
          else {
            rhs_03._M_str = "steam";
            rhs_03._M_len = 5;
            bVar4 = jessilib::equalsi<char,char>(command_split.first,rhs_03);
            if (bVar4) {
              __args = 5;
            }
            else {
              rhs_04._M_str = "name";
              rhs_04._M_len = 4;
              bVar4 = jessilib::equalsi<char,char>(command_split.first,rhs_04);
              if (bVar4) {
                __args = 6;
              }
              else {
                rhs_05._M_str = "banner";
                rhs_05._M_len = 6;
                bVar4 = jessilib::equalsi<char,char>(command_split.first,rhs_05);
                if (bVar4) {
                  __args = 7;
                }
                else {
                  rhs_06._M_str = "active";
                  rhs_06._M_len = 6;
                  bVar4 = jessilib::equalsi<char,char>(command_split.first,rhs_06);
                  if (bVar4) {
                    __args = 8;
                  }
                  else {
                    params._M_len = parameters._M_len;
                    params._M_str = parameters._M_str;
                    __args = 0;
                  }
                }
              }
            }
          }
        }
      }
    }
    out._M_dataplus._M_p = (pointer)&out.field_2;
    out._M_string_length = 0;
    out.field_2._M_local_buf[0] = '\0';
    types._M_dataplus._M_p = (pointer)&types.field_2;
    types._M_string_length = 0;
    types.field_2._M_local_buf[0] = '\0';
    local_308 = pcVar8;
    for (lVar9 = 0; lVar9 != plVar6[1] - *plVar6 >> 3; lVar9 = lVar9 + 1) {
      entry = *(Entry **)(*plVar6 + lVar9 * 8);
      bVar4 = std::function<bool_(unsigned_int)>::operator()(&isMatch,__args);
      if (bVar4) {
        Jupiter::Socket::ntop4_abi_cxx11_((uint)&ip_str);
        lVar1 = (entry->timestamp).__d.__r;
        added_time = lVar1 / 1000000000;
        lVar2 = (entry->length).__r;
        if (lVar2 == 0) {
          builtin_strncpy(expireStr,"never",6);
          uVar3 = expireStr._0_4_;
          expireStr._0_8_ = CONCAT44(expireStr._4_4_,uVar3);
        }
        else {
          expire_time = (lVar2 * 1000000000 + lVar1) / 1000000000;
          ptVar7 = localtime((time_t *)&expire_time);
          strftime(expireStr,0x100,"%b %d %Y, %H:%M:%S",ptVar7);
        }
        ptVar7 = localtime(&added_time);
        strftime(dateStr,0x100,"%b %d %Y, %H:%M:%S",ptVar7);
        if ((entry->flags & 0x7fff) == 0) {
          expire_time = 6;
          local_320 = " NULL;";
          std::__cxx11::string::assign<std::basic_string_view<char,std::char_traits<char>>>
                    ((string *)&types,
                     (basic_string_view<char,_std::char_traits<char>_> *)&expire_time);
        }
        else {
          types._M_string_length = 0;
          *types._M_dataplus._M_p = '\0';
          uVar5 = *(uint *)&entry->flags;
          if ((uVar5 >> 0xe & 1) != 0) {
            expire_time = 5;
            local_320 = " rdns";
            std::__cxx11::string::append<std::basic_string_view<char,std::char_traits<char>>>
                      ((string *)&types,
                       (basic_string_view<char,_std::char_traits<char>_> *)&expire_time);
            uVar5 = (uint)entry->flags;
          }
          if ((char)uVar5 < '\0') {
            expire_time = 5;
            local_320 = " game";
            std::__cxx11::string::append<std::basic_string_view<char,std::char_traits<char>>>
                      ((string *)&types,
                       (basic_string_view<char,_std::char_traits<char>_> *)&expire_time);
            uVar5 = (uint)entry->flags;
          }
          if ((uVar5 & 0x40) != 0) {
            expire_time = 5;
            local_320 = " chat";
            std::__cxx11::string::append<std::basic_string_view<char,std::char_traits<char>>>
                      ((string *)&types,
                       (basic_string_view<char,_std::char_traits<char>_> *)&expire_time);
            uVar5 = (uint)entry->flags;
          }
          if ((uVar5 & 0x20) != 0) {
            expire_time = 4;
            local_320 = " bot";
            std::__cxx11::string::append<std::basic_string_view<char,std::char_traits<char>>>
                      ((string *)&types,
                       (basic_string_view<char,_std::char_traits<char>_> *)&expire_time);
            uVar5 = (uint)entry->flags;
          }
          if ((uVar5 & 0x10) != 0) {
            expire_time = 5;
            local_320 = " vote";
            std::__cxx11::string::append<std::basic_string_view<char,std::char_traits<char>>>
                      ((string *)&types,
                       (basic_string_view<char,_std::char_traits<char>_> *)&expire_time);
            uVar5 = (uint)entry->flags;
          }
          if ((uVar5 & 8) != 0) {
            expire_time = 5;
            local_320 = " mine";
            std::__cxx11::string::append<std::basic_string_view<char,std::char_traits<char>>>
                      ((string *)&types,
                       (basic_string_view<char,_std::char_traits<char>_> *)&expire_time);
            uVar5 = (uint)entry->flags;
          }
          if ((uVar5 & 4) != 0) {
            expire_time = 7;
            local_320 = " ladder";
            std::__cxx11::string::append<std::basic_string_view<char,std::char_traits<char>>>
                      ((string *)&types,
                       (basic_string_view<char,_std::char_traits<char>_> *)&expire_time);
            uVar5 = (uint)entry->flags;
          }
          if ((uVar5 & 2) != 0) {
            expire_time = 6;
            local_320 = " alert";
            std::__cxx11::string::append<std::basic_string_view<char,std::char_traits<char>>>
                      ((string *)&types,
                       (basic_string_view<char,_std::char_traits<char>_> *)&expire_time);
          }
          expire_time = 1;
          local_320 = ";";
          std::__cxx11::string::append<std::basic_string_view<char,std::char_traits<char>>>
                    ((string *)&types,
                     (basic_string_view<char,_std::char_traits<char>_> *)&expire_time);
        }
        pcVar8 = "04in";
        if ((short)entry->flags < 0) {
          pcVar8 = "12";
        }
        string_printf_abi_cxx11_
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&expire_time
                   ,
                   "ID: %lu (\x03%sactive\x03); Added: %s; Expires: %s; IP: %.*s/%u; HWID: %.*s; Steam: %llu; Types:%.*s Name: %.*s; Banner: %.*s"
                   ,lVar9,pcVar8,dateStr,expireStr,ip_str._M_string_length,ip_str._M_dataplus._M_p,
                   (ulong)entry->prefix_length,(entry->hwid)._M_string_length,
                   (entry->hwid)._M_dataplus._M_p,entry->steamid,types._M_string_length,
                   types._M_dataplus._M_p,(entry->name)._M_string_length,
                   (entry->name)._M_dataplus._M_p,(entry->banner)._M_string_length,
                   (entry->banner)._M_dataplus._M_p);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                  (&out,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &expire_time);
        std::__cxx11::string::~string((string *)&expire_time);
        if ((entry->rdns)._M_string_length != 0) {
          expire_time = 8;
          local_320 = "; RDNS: ";
          std::__cxx11::string::append<std::basic_string_view<char,std::char_traits<char>>>
                    ((string *)&out,(basic_string_view<char,_std::char_traits<char>_> *)&expire_time
                    );
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                    (&out,&entry->rdns);
        }
        if ((entry->reason)._M_string_length != 0) {
          expire_time = 10;
          local_320 = "; Reason: ";
          std::__cxx11::string::append<std::basic_string_view<char,std::char_traits<char>>>
                    ((string *)&out,(basic_string_view<char,_std::char_traits<char>_> *)&expire_time
                    );
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                    (&out,&entry->reason);
        }
        Jupiter::IRC::Client::sendNotice
                  (local_300,local_2f8,local_308,out._M_string_length,out._M_dataplus._M_p);
        std::__cxx11::string::~string((string *)&ip_str);
      }
    }
    if (out._M_string_length == 0) {
      Jupiter::IRC::Client::sendNotice(local_300,local_2f8,local_308,0x11,"No matches found.");
    }
    std::__cxx11::string::~string((string *)&types);
    std::__cxx11::string::~string((string *)&out);
    std::_Function_base::~_Function_base(&isMatch.super__Function_base);
  }
  return;
}

Assistant:

void BanSearchIRCCommand::trigger(IRC_Bot *source, std::string_view channel, std::string_view nick, std::string_view parameters) {
	const auto& entries = RenX::banDatabase->getEntries();
	if (!parameters.empty()) {
		if (entries.size() == 0) {
			source->sendNotice(nick, "The ban database is empty!"sv);
		}
		else {
			auto command_split = jessilib::word_split_once_view(std::string_view{parameters}, WHITESPACE_SV);

			RenX::BanDatabase::Entry *entry;
			std::string_view params = command_split.second;
			std::function<bool(unsigned int)> isMatch = [&](unsigned int type_l) -> bool {
				switch (type_l)
				{
				default:
				case 0:	// ANY
					return isMatch(1) || isMatch(2) || isMatch(3) || isMatch(4);
				case 1: // ALL
					return true;
				case 2:	// IP
					return entry->ip == Jupiter::asUnsignedInt(params); // TODO: Actually parse as an IP address...
				case 3: // HWID
					return entry->hwid == params;
				case 4: // RDNS
					return entry->rdns == params;
				case 5:	// STEAM
					return entry->steamid == Jupiter::asUnsignedLongLong(params);
				case 6:	// NAME
					return jessilib::equalsi(entry->name, params);
				case 7:	// BANNER
					return jessilib::equalsi(entry->banner, params);
				case 8:	// ACTIVE
					return Jupiter::asBool(params) == entry->is_active();
				}
			};

			unsigned int type;
			std::string_view type_str = command_split.first;
			if (jessilib::equalsi(type_str, "all"sv) || type_str == "*"sv)
				type = 1;
			else if (jessilib::equalsi(type_str, "ip"sv))
				type = 2;
			else if (jessilib::equalsi(type_str, "hwid"sv))
				type = 3;
			else if (jessilib::equalsi(type_str, "rdns"sv))
				type = 4;
			else if (jessilib::equalsi(type_str, "steam"sv))
				type = 5;
			else if (jessilib::equalsi(type_str, "name"sv))
				type = 6;
			else if (jessilib::equalsi(type_str, "banner"sv))
				type = 7;
			else if (jessilib::equalsi(type_str, "active"sv))
				type = 8;
			else
			{
				type = 0;
				params = parameters;
			}

			std::string out;
			std::string types;
			char dateStr[256];
			char expireStr[256];
			for (size_t i = 0; i != entries.size(); i++) {
				entry = entries[i].get();
				if (isMatch(type)) {
					std::string ip_str = Jupiter::Socket::ntop4(entry->ip);

					time_t added_time = std::chrono::system_clock::to_time_t(entry->timestamp);
					if (entry->length.count() != 0) {
						time_t expire_time = std::chrono::system_clock::to_time_t(entry->timestamp + entry->length);
						strftime(expireStr, sizeof(expireStr), "%b %d %Y, %H:%M:%S", localtime(&expire_time));
					}
					else {
						std::strcpy(expireStr, "never");
					}
					strftime(dateStr, sizeof(dateStr), "%b %d %Y, %H:%M:%S", localtime(&added_time));

					if ((entry->flags & 0x7FFF) == 0)
						types = " NULL;"sv;
					else
					{
						types.clear();
						if (entry->is_rdns_ban())
							types += " rdns"sv;
						if (entry->is_type_game())
							types += " game"sv;
						if (entry->is_type_chat())
							types += " chat"sv;
						if (entry->is_type_bot())
							types += " bot"sv;
						if (entry->is_type_vote())
							types += " vote"sv;
						if (entry->is_type_mine())
							types += " mine"sv;
						if (entry->is_type_ladder())
							types += " ladder"sv;
						if (entry->is_type_alert())
							types += " alert"sv;
						types += ";"sv;
					}

					out = string_printf("ID: %lu (" IRCCOLOR "%sactive" IRCCOLOR "); Added: %s; Expires: %s; IP: %.*s/%u; HWID: %.*s; Steam: %llu; Types:%.*s Name: %.*s; Banner: %.*s",
						i, entry->is_active() ? "12" : "04in", dateStr, expireStr, ip_str.size(), ip_str.data(), entry->prefix_length, entry->hwid.size(), entry->hwid.data(), entry->steamid,
						types.size(), types.data(), entry->name.size(), entry->name.data(), entry->banner.size(), entry->banner.data());

					if (!entry->rdns.empty())
					{
						out += "; RDNS: "sv;
						out += entry->rdns;
					}
					if (!entry->reason.empty())
					{
						out += "; Reason: "sv;
						out += entry->reason;
					}
					source->sendNotice(nick, out);
				}
			}
			if (out.empty())
				source->sendNotice(nick, "No matches found."sv);
		}
	}
	else
		source->sendNotice(nick, string_printf("There are a total of %u entries in the ban database.", entries.size()));
}